

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void key_schedule_transform_post_ch1hash(ptls_key_schedule_t *sched)

{
  st_ptls_hash_context_t *psVar1;
  uint8_t ch1hash [64];
  
  psVar1 = sched->hashes[0].ctx;
  (*psVar1->final)(psVar1,ch1hash,PTLS_HASH_FINAL_MODE_RESET);
  key_schedule_update_ch1hash_prefix(sched);
  ptls__key_schedule_update_hash(sched,ch1hash,(sched->hashes[0].algo)->digest_size);
  return;
}

Assistant:

static void key_schedule_transform_post_ch1hash(ptls_key_schedule_t *sched)
{
    uint8_t ch1hash[PTLS_MAX_DIGEST_SIZE];

    key_schedule_extract_ch1hash(sched, ch1hash);

    key_schedule_update_ch1hash_prefix(sched);
    ptls__key_schedule_update_hash(sched, ch1hash, sched->hashes[0].algo->digest_size);
}